

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::PageTable::AllocateL3Table(PageTable *this,uint32_t L3TableSize,uint32_t L3AddrAlignment)

{
  int local_5c;
  undefined1 local_58 [4];
  int i;
  GMM_DEVICE_ALLOC Alloc;
  GMM_STATUS Status;
  uint32_t L3AddrAlignment_local;
  uint32_t L3TableSize_local;
  PageTable *this_local;
  
  Alloc.hCsr._4_4_ = 0;
  memset(local_58,0,0x30);
  if (this->PageTableMgr == (GmmPageTableMgr *)0x0) {
    this_local._4_4_ = GMM_INVALIDPARAM;
  }
  else {
    EnterCriticalSection(&this->TTLock);
    Alloc.Priv = this->PageTableMgr->hCsr;
    local_58 = (undefined1  [4])L3TableSize;
    i = L3AddrAlignment;
    Alloc.hCsr._4_4_ =
         __GmmDeviceAlloc(this->pClientContext,&this->PageTableMgr->DeviceCbInt,
                          (GMM_DEVICE_ALLOC *)local_58);
    if (Alloc.hCsr._4_4_ == GMM_SUCCESS) {
      (this->TTL3).GfxAddress = ((long)Alloc.Handle << 0x10) >> 0x10;
      (this->TTL3).CPUAddress = Alloc.GfxVA;
      (this->TTL3).NeedRegisterUpdate = true;
      (this->TTL3).L3Handle = (HANDLE)Alloc._0_8_;
      (this->TTL3).pGmmResInfo = (GMM_RESOURCE_INFO *)Alloc.CPUVA;
      for (local_5c = 0; local_5c < 0x1000; local_5c = local_5c + 1) {
        *(undefined8 *)((this->TTL3).CPUAddress + (long)local_5c * 8) = 0;
      }
      LeaveCriticalSection(&this->TTLock);
      this_local._4_4_ = Alloc.hCsr._4_4_;
    }
    else {
      LeaveCriticalSection(&this->TTLock);
      this_local._4_4_ = Alloc.hCsr._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::PageTable::AllocateL3Table(uint32_t L3TableSize, uint32_t L3AddrAlignment)
{
    GMM_STATUS       Status = GMM_SUCCESS;
    GMM_DEVICE_ALLOC Alloc  = {0};

    __GMM_ASSERTPTR(PageTableMgr, GMM_INVALIDPARAM);

    EnterCriticalSection(&TTLock);

    Alloc.Size      = L3TableSize;
    Alloc.Alignment = L3AddrAlignment;
    Alloc.hCsr      = PageTableMgr->hCsr;

    Status = __GmmDeviceAlloc(pClientContext, &PageTableMgr->DeviceCbInt, &Alloc);
    if(Status != GMM_SUCCESS)
    {
        LeaveCriticalSection(&TTLock);
        return Status;
    }

    TTL3.GfxAddress         = GMM_GFX_ADDRESS_CANONIZE(Alloc.GfxVA);
    TTL3.CPUAddress         = Alloc.CPUVA;
    TTL3.NeedRegisterUpdate = true;
    TTL3.L3Handle           = (HANDLE)(uintptr_t)Alloc.Handle;
    TTL3.pGmmResInfo        = (GMM_RESOURCE_INFO *)Alloc.Priv;

    // Invalidate L3e's
    for(int i = 0; i < (GMM_L3_SIZE(TTType)); i++)
    {
        //initialize L3e ie mark all entries with Null tile/invalid value
        ((GMM_AUXTTL3e *)TTL3.CPUAddress)[i].Value = 0;

    }

    LeaveCriticalSection(&TTLock);
    return Status;
}